

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

StringRef __thiscall llvm::AArch64::getArchExtFeature(AArch64 *this,StringRef ArchExt)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  AArch64 *pAVar3;
  char *pcVar4;
  long lVar5;
  char *__s;
  bool bVar6;
  StringRef SVar7;
  
  pcVar4 = ArchExt.Data;
  if (((char *)0x1 < pcVar4) && (*(short *)this == 0x6f6e)) {
    bVar6 = false;
    lVar5 = 0;
    pAVar3 = this + 2;
    do {
      __s = *(char **)((long)&DAT_0025a710 + lVar5);
      if ((__s != (char *)0x0) &&
         (pcVar1 = *(char **)((long)&DAT_0025a6f8 + lVar5), pcVar4 + -2 == pcVar1)) {
        if (pcVar1 != (char *)0x0) {
          iVar2 = bcmp(this + 2,*(void **)((long)&(anonymous_namespace)::AArch64ARCHExtNames + lVar5
                                          ),(size_t)pcVar1);
          pAVar3 = (AArch64 *)CONCAT44(extraout_var,iVar2);
          if (iVar2 != 0) goto LAB_001ce55a;
        }
        pAVar3 = (AArch64 *)strlen(__s);
        break;
      }
LAB_001ce55a:
      lVar5 = lVar5 + 0x28;
      bVar6 = lVar5 == 0x2d0;
    } while (!bVar6);
    if (!bVar6) goto LAB_001ce5d1;
  }
  pAVar3 = (AArch64 *)0x0;
  lVar5 = 0;
  do {
    __s = *(char **)((long)&DAT_0025a708 + lVar5);
    if (((__s != (char *)0x0) &&
        (pcVar1 = *(char **)((long)&DAT_0025a6f8 + lVar5), pcVar1 == pcVar4)) &&
       ((pcVar1 == (char *)0x0 ||
        (iVar2 = bcmp(this,*(void **)((long)&(anonymous_namespace)::AArch64ARCHExtNames + lVar5),
                      (size_t)pcVar1), iVar2 == 0)))) {
      pAVar3 = (AArch64 *)strlen(__s);
      goto LAB_001ce5d1;
    }
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0x2d0);
  __s = (char *)0x0;
LAB_001ce5d1:
  SVar7.Length = (size_t)pAVar3;
  SVar7.Data = __s;
  return SVar7;
}

Assistant:

StringRef llvm::AArch64::getArchExtFeature(StringRef ArchExt) {
  if (ArchExt.startswith("no")) {
    StringRef ArchExtBase(ArchExt.substr(2));
    for (const auto &AE : AArch64ARCHExtNames) {
      if (AE.NegFeature && ArchExtBase == AE.getName())
        return StringRef(AE.NegFeature);
    }
  }

  for (const auto &AE : AArch64ARCHExtNames)
    if (AE.Feature && ArchExt == AE.getName())
      return StringRef(AE.Feature);
  return StringRef();
}